

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkLock::IntLoadConstraint_Ct(ChLinkLock *this,uint off_L,ChVectorDynamic<> *Qc,double c)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  ChConstraintTwoBodies *pCVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  int i;
  int i_00;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  iVar6 = 0;
  for (i_00 = 0; i_00 < (this->mask).super_ChLinkMask.nconstr; i_00 = i_00 + 1) {
    pCVar3 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,i_00);
    if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)&this->Ct,
                          (long)iVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)(iVar6 + off_L));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = c;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SVar1;
      iVar6 = iVar6 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar5;
      auVar2 = vfmadd213sd_fma(auVar8,auVar7,auVar2);
      *pSVar5 = auVar2._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkLock::IntLoadConstraint_Ct(const unsigned int off_L,  // offset in Qc residual
                                      ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*Ct
                                      const double c)            // a scaling factor
{
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            Qc(off_L + cnt) += c * Ct(cnt);
            cnt++;
        }
    }

    // nothing to do for ChLinkLimit
}